

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

string * __thiscall
Json::normalizeEOL_abi_cxx11_(string *__return_storage_ptr__,Json *this,Location begin,Location end)

{
  Json *pJVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  while (this != (Json *)begin) {
    pJVar1 = this + 1;
    if (*this == (Json)0xd) {
      if ((pJVar1 != (Json *)begin) && (this[1] == (Json)0xa)) {
        pJVar1 = this + 2;
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      this = pJVar1;
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      this = pJVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string normalizeEOL(Reader::Location begin, Reader::Location end) {
  std::string normalized;
  normalized.reserve(end - begin);
  Reader::Location current = begin;
  while (current != end) {
    char c = *current++;
    if (c == '\r') {
      if (current != end && *current == '\n')
         // convert dos EOL
         ++current;
      // convert Mac EOL
      normalized += '\n';
    } else {
      normalized += c;
    }
  }
  return normalized;
}